

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::write
          (PromisedAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  AsyncOutputStream *pAVar1;
  _func_int **pp_Var2;
  SourceLocation location;
  AsyncOutputStream AVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  PromisedAsyncOutputStream *pPVar5;
  ForkHub<kj::_::Void> *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  ForkedPromise<void> local_80;
  code *local_70;
  AsyncOutputStream local_68;
  anon_class_24_2_4df0a340_for_func local_60;
  undefined *local_48;
  undefined *puStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  pPVar5 = (PromisedAsyncOutputStream *)CONCAT44(in_register_00000034,__fd);
  pAVar1 = (pPVar5->stream).ptr.ptr;
  if (pAVar1 == (AsyncOutputStream *)0x0) {
    ForkedPromise<void>::addBranch(&local_80);
    local_70 = kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2521:39)>
               ::anon_class_24_2_4df0a340_for_func::operator();
    pp_Var2 = local_80.hub.disposer[1]._vptr_Disposer;
    local_60.this = pPVar5;
    local_60.pieces.ptr = (ArrayPtr<const_unsigned_char> *)__buf;
    local_60.pieces.size_ = __n;
    if (pp_Var2 == (_func_int **)0x0 || (ulong)((long)local_80.hub.disposer - (long)pp_Var2) < 0x38)
    {
      pvVar4 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar4 + 0x3c8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2521:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80,
                 &local_60,&local_70);
      *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
    }
    else {
      local_80.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_80.hub.disposer + -7);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2521:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80,
                 &local_60,&local_70);
      local_80.hub.disposer[-6]._vptr_Disposer = pp_Var2;
    }
    local_48 = &DAT_0042a172;
    puStack_40 = &DAT_0042a1d1;
    local_38 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_80.hub.ptr = location_00;
    kj::_::maybeChain<void>((OwnPromiseNode *)&local_68,(Promise<void> *)&local_80.hub.ptr,location)
    ;
    AVar3._vptr_AsyncOutputStream = local_68._vptr_AsyncOutputStream;
    local_68._vptr_AsyncOutputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68);
    (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = AVar3._vptr_AsyncOutputStream;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80.hub.ptr);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80);
  }
  else {
    (*pAVar1->_vptr_AsyncOutputStream[1])(this,pAVar1,__buf,__n);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->write(pieces);
    }